

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastInt64ToBuffer(int64 i,char *buffer)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  
  buffer[0x15] = '\0';
  if (i < 0) {
    if ((ulong)i < 0xfffffffffffffff7) {
      uVar3 = (-i - 10U) / 10;
      buffer[0x14] = (char)(-i - 10U) + (char)uVar3 * -10 | 0x30;
      pbVar2 = (byte *)(buffer + 0x13);
      uVar3 = uVar3 + 1;
      do {
        *pbVar2 = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
        pbVar2 = pbVar2 + -1;
        bVar4 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar4);
    }
    else {
      buffer[0x14] = '0' - (char)i;
      pbVar2 = (byte *)(buffer + 0x13);
    }
    *pbVar2 = 0x2d;
  }
  else {
    pbVar1 = (byte *)(buffer + 0x15);
    do {
      pbVar2 = pbVar1 + -1;
      pbVar1[-1] = (char)i + (char)((ulong)i / 10) * -10 | 0x30;
      bVar4 = 9 < (ulong)i;
      pbVar1 = pbVar2;
      i = (ulong)i / 10;
    } while (bVar4);
  }
  return (char *)pbVar2;
}

Assistant:

char *FastInt64ToBuffer(int64 i, char* buffer) {
  // We could collapse the positive and negative sections, but that
  // would be slightly slower for positive numbers...
  // 22 bytes is enough to store -2**64, -18446744073709551616.
  char* p = buffer + kFastInt64ToBufferOffset;
  *p-- = '\0';
  if (i >= 0) {
    do {
      *p-- = '0' + i % 10;
      i /= 10;
    } while (i > 0);
    return p + 1;
  } else {
    // On different platforms, % and / have different behaviors for
    // negative numbers, so we need to jump through hoops to make sure
    // we don't divide negative numbers.
    if (i > -10) {
      i = -i;
      *p-- = '0' + i;
      *p = '-';
      return p;
    } else {
      // Make sure we aren't at MIN_INT, in which case we can't say i = -i
      i = i + 10;
      i = -i;
      *p-- = '0' + i % 10;
      // Undo what we did a moment ago
      i = i / 10 + 1;
      do {
        *p-- = '0' + i % 10;
        i /= 10;
      } while (i > 0);
      *p = '-';
      return p;
    }
  }
}